

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers.cc
# Opt level: O1

vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_> *
ctemplate::GetDefaultModifierForHtml(void)

{
  vector<ctemplate::ModifierAndValue_const*,std::allocator<ctemplate::ModifierAndValue_const*>>
  *in_RDI;
  
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  if (*(undefined8 **)(in_RDI + 8) == (undefined8 *)0x0) {
    std::
    vector<ctemplate::ModifierAndValue_const*,std::allocator<ctemplate::ModifierAndValue_const*>>::
    _M_realloc_insert<ctemplate::ModifierAndValue_const*const&>
              (in_RDI,(iterator)0x0,(ModifierAndValue **)(g_am_dirs + 8));
  }
  else {
    **(undefined8 **)(in_RDI + 8) = g_am_dirs._8_8_;
    *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + 8;
  }
  return (vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
          *)in_RDI;
}

Assistant:

vector<const ModifierAndValue*> GetDefaultModifierForHtml() {
  vector<const ModifierAndValue*> modvals;
  modvals.push_back(g_am_dirs[AM_HTML]);
  return modvals;
}